

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O1

void Vec_IntPushOrder(Vec_Int_t *p,int Entry)

{
  uint uVar1;
  bool bVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  
  uVar1 = p->nCap;
  if (p->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (p->pArray == (int *)0x0) {
        piVar3 = (int *)malloc(0x40);
      }
      else {
        piVar3 = (int *)realloc(p->pArray,0x40);
      }
      p->pArray = piVar3;
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar1 * 2;
      if (iVar5 <= (int)uVar1) goto LAB_003b1668;
      if (p->pArray == (int *)0x0) {
        piVar3 = (int *)malloc((ulong)uVar1 << 3);
      }
      else {
        piVar3 = (int *)realloc(p->pArray,(ulong)uVar1 << 3);
      }
      p->pArray = piVar3;
    }
    if (piVar3 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p->nCap = iVar5;
  }
LAB_003b1668:
  lVar4 = (long)p->nSize;
  p->nSize = p->nSize + 1;
  if (0 < lVar4) {
    piVar3 = p->pArray;
    do {
      iVar5 = piVar3[lVar4 + -1];
      if (iVar5 <= Entry) goto LAB_003b1696;
      piVar3[lVar4] = iVar5;
      bVar2 = 1 < lVar4;
      lVar4 = lVar4 + -1;
    } while (bVar2);
    lVar4 = 0;
  }
LAB_003b1696:
  p->pArray[(int)lVar4] = Entry;
  return;
}

Assistant:

static inline void Vec_IntPushOrder( Vec_Int_t * p, int Entry )
{
    int i;
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_IntGrow( p, 16 );
        else
            Vec_IntGrow( p, 2 * p->nCap );
    }
    p->nSize++;
    for ( i = p->nSize-2; i >= 0; i-- )
        if ( p->pArray[i] > Entry )
            p->pArray[i+1] = p->pArray[i];
        else
            break;
    p->pArray[i+1] = Entry;
}